

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::TeamcityMessages::testStarted
          (TeamcityMessages *this,string *name,string *flowId,bool captureStandardOutput)

{
  string *value;
  RaiiMessage msg;
  allocator<char> local_81;
  RaiiMessage local_80;
  string local_78;
  string local_58 [32];
  string local_38;
  
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_80,"testStarted",this->m_out);
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&local_80,"name",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string(local_58,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_80,(char *)local_58,value);
  std::__cxx11::string::~string(local_58);
  if (captureStandardOutput) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"true",&local_81);
    anon_unknown_1::RaiiMessage::writeProperty(&local_80,"captureStandardOutput",&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_80);
  return;
}

Assistant:

void TeamcityMessages::testStarted(const std::string& name, const std::string& flowId, const bool captureStandardOutput)
{
    RaiiMessage msg("testStarted", *m_out);
    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);

    if (captureStandardOutput)
        msg.writeProperty("captureStandardOutput", "true"); // false by default
}